

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void google::protobuf::compiler::cpp::anon_unknown_9::CollectMacroNames
               (Descriptor *message,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar4 = 0;
    do {
      lVar5 = *(long *)(message + 0x30);
      pcVar1 = *(char **)(lVar5 + lVar4 * 0xa8);
      bVar3 = false;
      do {
        iVar2 = std::__cxx11::string::compare(pcVar1);
        if (bVar3) break;
        bVar3 = true;
      } while (iVar2 != 0);
      if (iVar2 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(names,*(value_type **)(lVar5 + lVar4 * 0xa8));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      CollectMacroNames((Descriptor *)(*(long *)(message + 0x50) + lVar5),names);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xa8;
    } while (lVar4 < *(int *)(message + 0x48));
  }
  return;
}

Assistant:

void CollectMacroNames(const Descriptor* message, std::vector<string>* names) {
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    if (IsMacroName(field->name())) {
      names->push_back(field->name());
    }
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    CollectMacroNames(message->nested_type(i), names);
  }
}